

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

ClassObject * __thiscall LiteScript::ClassObject::operator=(ClassObject *this,ClassObject *obj)

{
  pointer ppVar1;
  pointer ppVar2;
  State *pSVar3;
  long lVar4;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::clear(&this->members);
  ppVar1 = (obj->members).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (obj->members).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = 0; (((long)ppVar1 - (long)ppVar2) / 0x30 & 0xffffffffU) * 0x30 - lVar4 != 0;
      lVar4 = lVar4 + 0x30) {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
    ::push_back(&this->members,
                (value_type *)
                ((long)&(((obj->members).
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus + lVar4));
  }
  pSVar3 = obj->ScriptState;
  this->ClassBase = obj->ClassBase;
  this->ScriptState = pSVar3;
  return this;
}

Assistant:

LiteScript::ClassObject& LiteScript::ClassObject::operator=(const ClassObject &obj) {
    this->members.clear();
    for (unsigned int i = 0, sz = obj.members.size(); i < sz; i++)
        this->members.push_back(obj.members[i]);
    this->ClassBase = obj.ClassBase;
    this->ScriptState = obj.ScriptState;
    return *this;
}